

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void remove_range_closed_at(art_t *art,uint8_t *high48,uint16_t min,uint16_t max)

{
  art_val_t *paVar1;
  container_t *c;
  uint8_t *unaff_retaddr;
  container_t *container2;
  uint32_t in_stack_00000010;
  uint8_t typecode2;
  leaf_t *leaf;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd8;
  art_key_chunk_t in_stack_ffffffffffffffdf;
  
  paVar1 = art_find((art_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                    (art_key_chunk_t *)0x10df4d);
  if ((paVar1 != (art_val_t *)0x0) &&
     (c = container_remove_range(leaf,typecode2,in_stack_00000010,container2._4_4_,unaff_retaddr),
     c != *(container_t **)(paVar1[1].key + 2))) {
    container_free(c,in_stack_ffffffffffffffcf);
    if (c == (container_t *)0x0) {
      art_erase((art_t *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                (art_key_chunk_t *)0x0);
      free_leaf((leaf_t *)0x10dff0);
    }
    else {
      *(container_t **)(paVar1[1].key + 2) = c;
      paVar1[1].key[0] = in_stack_ffffffffffffffdf;
    }
  }
  return;
}

Assistant:

static inline void remove_range_closed_at(art_t *art, uint8_t *high48,
                                          uint16_t min, uint16_t max) {
    leaf_t *leaf = (leaf_t *)art_find(art, high48);
    if (leaf == NULL) {
        return;
    }
    uint8_t typecode2;
    container_t *container2 = container_remove_range(
        leaf->container, leaf->typecode, min, max, &typecode2);
    if (container2 != leaf->container) {
        container_free(leaf->container, leaf->typecode);
        if (container2 != NULL) {
            leaf->container = container2;
            leaf->typecode = typecode2;
        } else {
            art_erase(art, high48);
            free_leaf(leaf);
        }
    }
}